

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O2

bool COST_SENSITIVE::example_is_test(example *ec)

{
  float *pfVar1;
  bool bVar2;
  wclass *pwVar3;
  long lVar4;
  
  pwVar3 = (ec->l).cs.costs._begin;
  lVar4 = (long)(ec->l).cs.costs._end - (long)pwVar3;
  if (lVar4 == 0) {
    return true;
  }
  lVar4 = (lVar4 >> 4) + 1;
  while( true ) {
    lVar4 = lVar4 + -1;
    bVar2 = lVar4 == 0;
    if (lVar4 == 0) {
      return bVar2;
    }
    pfVar1 = &pwVar3->x;
    pwVar3 = pwVar3 + 1;
    if (*pfVar1 != 3.4028235e+38) break;
    if (NAN(*pfVar1)) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool example_is_test(example& ec)
{
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  if (costs.size() == 0)
    return true;
  for (size_t j = 0; j < costs.size(); j++)
    if (costs[j].x != FLT_MAX)
      return false;
  return true;
}